

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupToLevel(int remaining,bool apply_focus_to_window_under)

{
  ImGuiContext *pIVar1;
  ImGuiPopupRef *pIVar2;
  byte in_SIL;
  int in_EDI;
  ImGuiWindow *focus_window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImGuiWindow *window;
  ImGuiWindow *window_00;
  
  pIVar1 = GImGui;
  if (in_EDI < 1) {
    pIVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,0);
    window = pIVar2->ParentWindow;
  }
  else {
    pIVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,in_EDI + -1);
    window = pIVar2->Window;
  }
  window_00 = window;
  ImVector<ImGuiPopupRef>::resize((ImVector<ImGuiPopupRef> *)window,in_stack_ffffffffffffffdc);
  if ((in_SIL & 1) != 0) {
    if (pIVar1->NavLayer == ImGuiNavLayer_Main) {
      NavRestoreLastChildNavWindow(window);
    }
    FocusWindow(window_00);
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool apply_focus_to_window_under)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    g.OpenPopupStack.resize(remaining);

    // FIXME: This code is faulty and we may want to eventually to replace or remove the 'apply_focus_to_window_under=true' path completely.
    // Instead of using g.OpenPopupStack[remaining-1].Window etc. we should find the highest root window that is behind the popups we are closing.
    // The current code will set focus to the parent of the popup window which is incorrect. 
    // It rarely manifested until now because UpdateMouseMovingWindow() would call FocusWindow() again on the clicked window, 
    // leading to a chain of focusing A (clicked window) then B (parent window of the popup) then A again.
    // However if the clicked window has the _NoMove flag set we would be left with B focused.
    // For now, we have disabled this path when called from ClosePopupsOverWindow() because the users of ClosePopupsOverWindow() don't need to alter focus anyway,
    // but we should inspect and fix this properly.
    if (apply_focus_to_window_under)
    {
        if (g.NavLayer == 0)
            focus_window = NavRestoreLastChildNavWindow(focus_window);
        FocusWindow(focus_window);
    }
}